

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CheckArmorType
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  AInventory *pAVar6;
  uint uVar7;
  char *pcVar8;
  AActor *this;
  bool bVar9;
  FName local_34;
  PClass *pPVar5;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003ca3f0;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ca3e0:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ca3f0:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x4d2,
                  "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003ca334;
    pPVar5 = (this->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar3);
      (this->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar9 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar2 && bVar9) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar2) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ca3f0;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003ca3e0;
LAB_003ca334:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      iVar3 = param[1].field_0.i;
      if (numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003ca378;
        pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003ca378:
          iVar1 = param[2].field_0.i;
          pAVar6 = AActor::FindInventory(this,&local_34);
          iVar4 = 0;
          uVar7 = 0;
          if ((pAVar6 != (AInventory *)0x0) &&
             (*(int *)((long)&pAVar6[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) ==
              iVar3)) {
            uVar7 = (uint)(iVar1 <= pAVar6->Amount);
          }
          if (0 < numret) {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x4d8,
                            "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (ret->RegType != '\0') {
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
            *(uint *)ret->Location = uVar7;
            iVar4 = 1;
          }
          return iVar4;
        }
        pcVar8 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x4d4,
                    "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x4d3,
                "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckArmorType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME	 (type);
	PARAM_INT_DEF(amount);

	ABasicArmor *armor = (ABasicArmor *)self->FindInventory(NAME_BasicArmor);

	ACTION_RETURN_BOOL(armor && armor->ArmorType == type && armor->Amount >= amount);
}